

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::ruby::PackageToModule_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,string_view name)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_40;
  size_t i;
  undefined1 auStack_20 [7];
  bool next_upper;
  string_view name_local;
  string *result;
  
  name_local._M_len = name._M_len;
  bVar1 = true;
  _auStack_20 = this;
  name_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_40 = 0;
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20),
      local_40 < sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_40);
    if (*pvVar3 == '_') {
      bVar1 = true;
    }
    else {
      if (bVar1) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_40)
        ;
        UpperChar(*pvVar3);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20,local_40);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      bVar1 = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PackageToModule(absl::string_view name) {
  bool next_upper = true;
  std::string result;
  result.reserve(name.size());

  for (size_t i = 0; i < name.size(); i++) {
    if (name[i] == '_') {
      next_upper = true;
    } else {
      if (next_upper) {
        result.push_back(UpperChar(name[i]));
      } else {
        result.push_back(name[i]);
      }
      next_upper = false;
    }
  }

  return result;
}